

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

shared_ptr<chrono::ChLinkLockRevolute> __thiscall
chrono::curiosity::AddRevoluteJoint
          (curiosity *this,shared_ptr<chrono::ChBodyAuxRef> *body_1,
          shared_ptr<chrono::ChBodyAuxRef> *body_2,
          shared_ptr<chrono::curiosity::CuriosityChassis> *chassis,ChVector<double> *rel_joint_pos,
          ChQuaternion<double> *rel_joint_rot)

{
  ChFrame<double> *this_00;
  element_type *peVar1;
  ChFrame<double> *pCVar2;
  element_type *peVar3;
  ChCoordsys<double> *mv;
  ChCoordsys<double> *pCVar4;
  ChSystem *pCVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chrono::ChLinkLockRevolute> sVar6;
  shared_ptr<chrono::ChLinkBase> local_1f0;
  undefined1 local_1e0 [72];
  shared_ptr<chrono::ChBody> local_198;
  shared_ptr<chrono::ChBody> local_188;
  undefined1 local_171;
  undefined1 local_170 [8];
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  undefined1 local_50 [24];
  ChFrame<double> *X_GP;
  ChQuaternion<double> *rel_joint_rot_local;
  ChVector<double> *rel_joint_pos_local;
  shared_ptr<chrono::curiosity::CuriosityChassis> *chassis_local;
  shared_ptr<chrono::ChBodyAuxRef> *body_2_local;
  shared_ptr<chrono::ChBodyAuxRef> *body_1_local;
  shared_ptr<chrono::ChLinkLockRevolute> *joint;
  
  X_GP = (ChFrame<double> *)rel_joint_rot;
  rel_joint_rot_local = (ChQuaternion<double> *)rel_joint_pos;
  rel_joint_pos_local = (ChVector<double> *)chassis;
  chassis_local = (shared_ptr<chrono::curiosity::CuriosityChassis> *)body_2;
  body_2_local = body_1;
  body_1_local = (shared_ptr<chrono::ChBodyAuxRef> *)this;
  std::
  __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)chassis);
  CuriosityPart::GetBody((CuriosityPart *)local_50);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  pCVar2 = (ChFrame<double> *)(**(code **)(*(long *)peVar1 + 0x1f0))();
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_50);
  this_00 = (ChFrame<double> *)
            ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x40);
  local_50._16_8_ = pCVar2;
  ChFrame<double>::ChFrame
            (this_00,(ChVector<double> *)rel_joint_rot_local,(ChQuaternion<double> *)X_GP);
  ChFrame<double>::operator*
            ((ChFrame<double> *)local_170,(ChFrame<double> *)local_50._16_8_,this_00);
  local_171 = 0;
  chrono_types::make_shared<chrono::ChLinkLockRevolute,_0>();
  peVar3 = std::
           __shared_ptr_access<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>(&local_188,body_1);
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>(&local_198,body_2);
  mv = ChFrame<double>::GetCoord((ChFrame<double> *)local_170);
  pCVar4 = ChFrame<double>::GetCoord((ChFrame<double> *)local_170);
  ChCoordsys<double>::ChCoordsys((ChCoordsys<double> *)(local_1e0 + 0x10),&mv->pos,&pCVar4->rot);
  (**(code **)(*(long *)peVar3 + 0x250))(peVar3,&local_188,&local_198,local_1e0 + 0x10);
  std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_198);
  std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_188);
  std::
  __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)chassis);
  CuriosityPart::GetBody((CuriosityPart *)local_1e0);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1e0);
  pCVar5 = ChPhysicsItem::GetSystem((ChPhysicsItem *)peVar1);
  std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkLockRevolute,void>
            (&local_1f0,(shared_ptr<chrono::ChLinkLockRevolute> *)this);
  (**(code **)(*(long *)pCVar5 + 0x138))(pCVar5,&local_1f0);
  std::shared_ptr<chrono::ChLinkBase>::~shared_ptr(&local_1f0);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_1e0);
  local_171 = 1;
  ChFrame<double>::~ChFrame((ChFrame<double> *)local_170);
  ChFrame<double>::~ChFrame
            ((ChFrame<double> *)
             ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x40));
  sVar6.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar6.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkLockRevolute>)
         sVar6.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkLockRevolute> AddRevoluteJoint(std::shared_ptr<ChBodyAuxRef> body_1,
                                                     std::shared_ptr<ChBodyAuxRef> body_2,
                                                     std::shared_ptr<CuriosityChassis> chassis,
                                                     const ChVector<>& rel_joint_pos,
                                                     const ChQuaternion<>& rel_joint_rot) {
    const ChFrame<>& X_GP = chassis->GetBody()->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);                       // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                                       // global -> child

    auto joint = chrono_types::make_shared<ChLinkLockRevolute>();
    joint->Initialize(body_1, body_2, ChCoordsys<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    chassis->GetBody()->GetSystem()->AddLink(joint);

    return joint;
}